

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
jsoncons::decode_traits<std::vector<signed_char,std::allocator<signed_char>>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          decode_traits<std::vector<signed_char,std::allocator<signed_char>>,char,void> *this,
          basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *param_2,error_code *ec)

{
  int iVar1;
  char *pcVar2;
  error_code *ec_00;
  long lVar3;
  size_t sVar4;
  uint8_t local_51;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *local_50;
  byte_string_view bytes;
  
  (**(code **)(*(long *)this + 0x10))(this,param_2);
  if (*(int *)&(param_2->super_basic_json_visitor<char>)._vptr_basic_json_visitor == 0) {
    pcVar2 = (char *)(**(code **)(*(long *)this + 0x20))(this);
    if (*pcVar2 == '\x0e') {
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar3 = (**(code **)(*(long *)this + 0x20))(this);
      if (*(long *)(lVar3 + 0x18) != 0) {
        lVar3 = (**(code **)(*(long *)this + 0x20))(this);
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  (__return_storage_ptr__,*(size_type *)(lVar3 + 0x18));
      }
      bytes.data_ = (uint8_t *)&PTR__basic_json_visitor_0099bca0;
      bytes.size_ = (size_t)__return_storage_ptr__;
      (**(code **)(*(long *)this + 0x30))(this,&bytes,param_2);
      return __return_storage_ptr__;
    }
    if (*pcVar2 == '\x02') {
      ec_00 = (error_code *)(**(code **)(*(long *)this + 0x20))(this);
      basic_staj_event<char>::get<jsoncons::byte_string_view>
                ((basic_staj_event<char> *)&bytes,ec_00);
      iVar1 = *(int *)&(param_2->super_basic_json_visitor<char>)._vptr_basic_json_visitor;
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iVar1 != 0) {
        return __return_storage_ptr__;
      }
      lVar3 = (**(code **)(*(long *)this + 0x20))(this);
      if (*(long *)(lVar3 + 0x18) != 0) {
        lVar3 = (**(code **)(*(long *)this + 0x20))(this);
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  (__return_storage_ptr__,*(size_type *)(lVar3 + 0x18));
      }
      local_50 = param_2;
      for (sVar4 = 0; bytes.size_ != sVar4; sVar4 = sVar4 + 1) {
        local_51 = bytes.data_[sVar4];
        std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                  (__return_storage_ptr__,(char *)&local_51);
      }
      (**(code **)(*(long *)this + 0x40))(this,local_50);
      return __return_storage_ptr__;
    }
    std::error_code::operator=((error_code *)param_2,not_vector);
  }
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>&, 
            std::error_code& ec)
        {
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            switch (cursor.current().event_type())
            {
                case staj_event_type::byte_string_value:
                {
                    auto bytes = cursor.current().template get<byte_string_view>(ec);
                    if (!ec) 
                    {
                        T v;
                        if (cursor.current().size() > 0)
                        {
                            reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                        }
                        for (auto ch : bytes)
                        {
                            v.push_back(static_cast<value_type>(ch));
                        }
                        cursor.next(ec);
                        return v;
                    }
                    else
                    {
                        return T{};
                    }
                }
                case staj_event_type::begin_array:
                {
                    T v;
                    if (cursor.current().size() > 0)
                    {
                        reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                    }
                    typed_array_visitor<T> visitor(v);
                    cursor.read_to(visitor, ec);
                    return v;
                }
                default:
                {
                    ec = conv_errc::not_vector;
                    return T{};
                }
            }
        }